

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void pmevcntr_op_start(CPUARMState_conflict *env,uint8_t counter)

{
  uint64_t *puVar1;
  _Bool _Var2;
  uint uVar3;
  uint64_t uVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  uVar5 = CONCAT71(in_register_00000031,counter) & 0xffffffff;
  uVar4 = (env->cp15).c14_pmevtyper[uVar5];
  if ((ushort)uVar4 < 0x3d) {
    uVar3 = (uint)uVar4;
    if (supported_event_map[uVar3 & 0x3f] != 0xffff) {
      uVar4 = (*pm_events[supported_event_map[uVar3 & 0x3f]].get_count)(env);
      goto LAB_00613b1a;
    }
  }
  uVar4 = 0;
LAB_00613b1a:
  _Var2 = pmu_counter_enabled(env,counter);
  if (_Var2) {
    uVar3 = (int)uVar4 - (int)(env->cp15).c14_pmevcntr_delta[uVar5];
    if ((int)(~uVar3 & (uint)(env->cp15).c14_pmevcntr[uVar5]) < 0) {
      puVar1 = &(env->cp15).c9_pmovsr;
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
    }
    (env->cp15).c14_pmevcntr[uVar5] = (ulong)uVar3;
  }
  (env->cp15).c14_pmevcntr_delta[uVar5] = uVar4;
  return;
}

Assistant:

static void pmevcntr_op_start(CPUARMState *env, uint8_t counter)
{

    uint16_t event = env->cp15.c14_pmevtyper[counter] & PMXEVTYPER_EVTCOUNT;
    uint64_t count = 0;
    if (event_supported(event)) {
        uint16_t event_idx = supported_event_map[event];
        count = pm_events[event_idx].get_count(env);
    }

    if (pmu_counter_enabled(env, counter)) {
        uint32_t new_pmevcntr = count - env->cp15.c14_pmevcntr_delta[counter];

        if (env->cp15.c14_pmevcntr[counter] & ~new_pmevcntr & INT32_MIN) {
            env->cp15.c9_pmovsr |= (1ULL << counter);
        }
        env->cp15.c14_pmevcntr[counter] = new_pmevcntr;
    }
    env->cp15.c14_pmevcntr_delta[counter] = count;
}